

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlInitializeSpecial(Ssw_Sml_t *p,Vec_Int_t *vInit)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  ulong uVar5;
  
  pAVar2 = p->pAig;
  uVar1 = pAVar2->nRegs;
  if ((int)uVar1 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a5,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  if ((int)uVar1 <= pAVar2->nObjs[2]) {
    if (vInit->nSize == p->nWordsFrame * uVar1) {
      for (iVar4 = 0; iVar4 < pAVar2->nTruePis; iVar4 = iVar4 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAVar2->vCis,iVar4);
        Ssw_SmlAssignRandom(p,pAVar3);
        pAVar2 = p->pAig;
      }
      for (uVar5 = 0; (long)uVar5 < (long)vInit->nSize; uVar5 = uVar5 + 1) {
        iVar4 = vInit->pArray[uVar5];
        pAVar3 = Saig_ManLo(p->pAig,(int)((uVar5 & 0xffffffff) % (ulong)uVar1));
        Ssw_SmlObjAssignConstWord(p,pAVar3,iVar4,0,(int)((uVar5 & 0xffffffff) / (ulong)uVar1));
      }
      return;
    }
    __assert_fail("Vec_IntSize(vInit) == nRegs * p->nWordsFrame",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3a7,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
  }
  __assert_fail("nRegs <= Aig_ManCiNum(p->pAig)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x3a6,"void Ssw_SmlInitializeSpecial(Ssw_Sml_t *, Vec_Int_t *)");
}

Assistant:

void Ssw_SmlInitializeSpecial( Ssw_Sml_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj;
    int Entry, i, nRegs;
    nRegs = Aig_ManRegNum(p->pAig);
    assert( nRegs > 0 );
    assert( nRegs <= Aig_ManCiNum(p->pAig) );
    assert( Vec_IntSize(vInit) == nRegs * p->nWordsFrame );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // assign the initial state for the latches
    Vec_IntForEachEntry( vInit, Entry, i )
        Ssw_SmlObjAssignConstWord( p, Saig_ManLo(p->pAig, i % nRegs), Entry, 0, i / nRegs );
}